

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QUrl,unsigned_int>::emplace_helper<unsigned_int_const&>
          (QHash<QUrl,_unsigned_int> *this,QUrl *key,uint *args)

{
  long lVar1;
  piter it;
  piter pVar2;
  iterator<QHashPrivate::Node<QUrl,_unsigned_int>_> *in_RDX;
  Data<QHashPrivate::Node<QUrl,_unsigned_int>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<QUrl,_unsigned_int>_> *in_stack_ffffffffffffff90;
  QUrl *in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<QUrl,_unsigned_int>_>::findOrInsert<QUrl>
            (in_RSI,(QUrl *)in_RDX);
  QHashPrivate::iterator<QHashPrivate::Node<QUrl,_unsigned_int>_>::node(in_RDX);
  QHashPrivate::Node<QUrl,unsigned_int>::createInPlace<unsigned_int_const&>
            ((Node<QUrl,_unsigned_int> *)in_RDX,in_stack_ffffffffffffff98,
             (uint *)in_stack_ffffffffffffff90);
  it.bucket = (size_t)in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  QHash<QUrl,_unsigned_int>::iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }